

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interactions.cc
# Opt level: O2

void INTERACTIONS::expand_namespaces_with_recursion
               (string *ns,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *res,string *val,size_t pos)

{
  uchar j;
  char cVar1;
  
  if (ns->_M_string_length == pos) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(res,val);
    return;
  }
  if ((ns->_M_dataplus)._M_p[pos] == ':') {
    cVar1 = ' ';
    do {
      if ((cVar1 != ':') && (cVar1 != '|')) {
        if (cVar1 == '\x7f') {
          return;
        }
        std::__cxx11::string::push_back((char)val);
        expand_namespaces_with_recursion(ns,res,val,pos + 1);
        std::__cxx11::string::pop_back();
      }
      cVar1 = cVar1 + '\x01';
    } while( true );
  }
  std::__cxx11::string::push_back((char)val);
  expand_namespaces_with_recursion(ns,res,val,pos + 1);
  std::__cxx11::string::pop_back();
  return;
}

Assistant:

void expand_namespaces_with_recursion(
    std::string const& ns, std::vector<std::string>& res, std::string& val, size_t pos)
{
  assert(pos <= ns.size());

  if (pos == ns.size())
  {
    // we're at the end of interaction

    // and store it in res
    res.push_back(val);
    // don't free s memory as it's data will be used later
  }
  else
  {
    // we're at the middle of interaction
    if (ns[pos] != ':')
    {
      // not a wildcard
      val.push_back(ns[pos]);
      expand_namespaces_with_recursion(ns, res, val, pos + 1);
      val.pop_back();  // i don't need value itself
    }
    else
    {
      for (unsigned char j = printable_start; j <= printable_end; ++j)
      {
        if (valid_ns(j))
        {
          val.push_back(j);
          expand_namespaces_with_recursion(ns, res, val, pos + 1);
          val.pop_back();  // i don't need value itself
        }
      }
    }
  }
}